

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O3

void emtval(emtcxdef *ctx,tokdef *tok,uchar *base)

{
  ushort uVar1;
  uchar *puVar2;
  ushort uVar3;
  uchar uVar4;
  
  switch(tok->toktyp) {
  case 0x35:
    uVar4 = '\x1d';
    break;
  case 0x36:
    uVar4 = '\x1f';
    break;
  case 0x37:
    emtres(ctx,1);
    uVar1 = ctx->emtcxofs;
    ctx->emtcxofs = uVar1 + 1;
    ctx->emtcxptr[uVar1] = '\x01';
    emtres(ctx,4);
    *(int *)(ctx->emtcxptr + ctx->emtcxofs) = (int)tok->tokval;
    ctx->emtcxofs = ctx->emtcxofs + 4;
    return;
  case 0x38:
    switch((tok->toksym).tokstyp) {
    case '\x01':
    case '\b':
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '#';
      break;
    case '\x02':
    case '\a':
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '\x02';
      break;
    case '\x03':
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '<';
      goto LAB_001209f0;
    case '\x04':
      uVar3 = (tok->toksym).toksfr;
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      if (uVar3 == 0) {
        ctx->emtcxptr[uVar1] = '\x14';
      }
      else {
        ctx->emtcxptr[uVar1] = 'Q';
        emtres(ctx,2);
        *(objnum *)(ctx->emtcxptr + ctx->emtcxofs) = ctx->emtcxfrob;
        ctx->emtcxofs = ctx->emtcxofs + 2;
        emtres(ctx,2);
        *(ushort *)(ctx->emtcxptr + ctx->emtcxofs) = (tok->toksym).toksfr;
        ctx->emtcxofs = ctx->emtcxofs + 2;
      }
      break;
    case '\x05':
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '\x1c';
      return;
    case '\x06':
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '\x1e';
LAB_001209f0:
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '\0';
      break;
    default:
      errsigf(ctx->emtcxerr,"TADS",0x132);
    case '\r':
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = 'L';
      return;
    case '\x0e':
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '$';
    }
    emtres(ctx,2);
    puVar2 = ctx->emtcxptr;
    uVar1 = ctx->emtcxofs;
    uVar3 = (tok->toksym).toksval;
LAB_00120a2a:
    *(ushort *)(puVar2 + uVar1) = uVar3;
    ctx->emtcxofs = ctx->emtcxofs + 2;
    return;
  default:
    switch(tok->toktyp) {
    case 0x4c:
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = ' ';
      emtlst(ctx,(uint)tok->tokofs,base);
      return;
    case 0x4d:
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '!';
      return;
    case 0x4e:
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = '\"';
      return;
    case 0x55:
      emtres(ctx,1);
      uVar1 = ctx->emtcxofs;
      ctx->emtcxofs = uVar1 + 1;
      ctx->emtcxptr[uVar1] = 'C';
      emtres(ctx,2);
      puVar2 = ctx->emtcxptr;
      uVar1 = ctx->emtcxofs;
      uVar3 = tok->tokofs;
      goto LAB_00120a2a;
    }
    goto switchD_001206e5_caseD_4f;
  }
  emtres(ctx,1);
  uVar1 = ctx->emtcxofs;
  ctx->emtcxofs = uVar1 + 1;
  ctx->emtcxptr[uVar1] = uVar4;
switchD_001206e5_caseD_4f:
  uVar1 = *(ushort *)(base + tok->tokofs);
  emtres(ctx,uVar1);
  memcpy(ctx->emtcxptr + ctx->emtcxofs,base + tok->tokofs,(ulong)uVar1);
  ctx->emtcxofs = ctx->emtcxofs + uVar1;
  return;
}

Assistant:

void emtval(emtcxdef *ctx, tokdef *tok, uchar *base)
{
    ushort oplen;
        
    switch(tok->toktyp)
    {
    case TOKTSYMBOL:
        switch(tok->toksym.tokstyp)
        {
        case TOKSTARGC:
            emtop(ctx, OPCARGC);
            return;
            
        case TOKSTSELF:
            emtop(ctx, OPCPUSHSELF);
            return;
            
        case TOKSTOBJ:
        case TOKSTFWDOBJ:
            emtop(ctx, OPCPUSHOBJ);
            break;
        case TOKSTLOCAL:
            if (tok->toksym.toksfr)
            {
                emtop(ctx, OPCGETDBLCL);   /* debug local - specifies frame */
                emtint2(ctx, ctx->emtcxfrob);          /* emit frame object */
                emtint2(ctx, tok->toksym.toksfr);      /* emit frame offset */
            }
            else
                emtop(ctx, OPCGETLCL);
            break;
            
        case TOKSTBIFN:
            emtop(ctx, OPCBUILTIN);
            emtbyte(ctx, 0);
            break;
        case TOKSTFUNC:
        case TOKSTFWDFN:
            emtop(ctx, OPCPUSHFN);
            break;
        case TOKSTPROP:
            emtop(ctx, OPCGETPSELF);
            emtbyte(ctx, 0);
            break;
        case TOKSTPROPSPEC:
            emtop(ctx, OPCGETPSELFDATA);
            break;
        default:
            errsig(ctx->emtcxerr, ERR_REQOBJ);
            /* NOTREACHED */
        }
        emtint2(ctx, tok->toksym.toksval);
        return;

    case TOKTNUMBER:
        emtop(ctx, OPCPUSHNUM);
        emtint4(ctx, tok->tokval);
        return;

    case TOKTNIL:
        emtop(ctx, OPCPUSHNIL);
        return;
    case TOKTTRUE:
        emtop(ctx, OPCPUSHTRUE);
        return;
        
    case TOKTPOUND:
        emtop(ctx, OPCPUSHPN);
        emtint2(ctx, tok->tokofs);
        return;

    case TOKTSSTRING:
        emtop(ctx, OPCPUSHSTR);
        break;
    case TOKTDSTRING:
        emtop(ctx, OPCSAY);
        break;
    case TOKTLIST:
        emtop(ctx, OPCPUSHLST);
        emtlst(ctx, (uint)tok->tokofs, base);
        return;
    }

    /* if we haven't returned already, we have a large operand */
    oplen = osrp2(base + tok->tokofs);
    emtmem(ctx, base + tok->tokofs, oplen);
}